

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_writec(EditLine *el,wint_t c)

{
  size_t sVar1;
  size_t n;
  wchar_t visbuf [9];
  wchar_t local_38 [10];
  
  sVar1 = ct_visual_char(local_38,8,c);
  n = 0;
  if (0 < (long)sVar1) {
    n = sVar1;
  }
  local_38[n] = L'\0';
  terminal_overwrite(el,local_38,n);
  fflush((FILE *)el->el_outfile);
  return;
}

Assistant:

libedit_private void
terminal_writec(EditLine *el, wint_t c)
{
	wchar_t visbuf[VISUAL_WIDTH_MAX +1];
	ssize_t vcnt = ct_visual_char(visbuf, VISUAL_WIDTH_MAX, c);
	if (vcnt < 0)
		vcnt = 0;
	visbuf[vcnt] = '\0';
	terminal_overwrite(el, visbuf, (size_t)vcnt);
	terminal__flush(el);
}